

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool TwoBytesTest2<Blob<256>>(pfHash hash,int maxlen,bool drawDiagram)

{
  bool bVar1;
  byte in_DL;
  bool result;
  HashCallback<Blob<256>_> c;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  bool in_stack_000000ab;
  bool in_stack_000000ac;
  bool in_stack_000000ad;
  bool in_stack_000000ae;
  bool in_stack_000000af;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_000000b0;
  KeyCallback *in_stack_000000c8;
  int in_stack_000000d4;
  hashvec *hashes_00;
  undefined4 in_stack_ffffffffffffffa8;
  byte bVar2;
  undefined4 in_stack_ffffffffffffffac;
  HashCallback<Blob<256>_> *in_stack_ffffffffffffffb0;
  hashvec local_28;
  byte local_d;
  
  local_d = in_DL & 1;
  hashes_00 = &local_28;
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x19fce4);
  HashCallback<Blob<256>_>::HashCallback
            (in_stack_ffffffffffffffb0,
             (pfHash)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),hashes_00);
  TwoBytesKeygen(in_stack_000000d4,in_stack_000000c8);
  bVar2 = 1;
  bVar1 = TestHashList<Blob<256>>
                    (in_stack_000000b0,in_stack_000000af,in_stack_000000ae,in_stack_000000ad,
                     in_stack_000000ac,in_stack_000000ab);
  bVar2 = bVar1 & bVar2;
  printf("\n");
  HashCallback<Blob<256>_>::~HashCallback((HashCallback<Blob<256>_> *)0x19fd6c);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)in_stack_ffffffffffffffb0);
  return (bool)(bVar2 & 1);
}

Assistant:

bool TwoBytesTest2 ( pfHash hash, int maxlen, bool drawDiagram )
{
  std::vector<hashtype> hashes;

  HashCallback<hashtype> c(hash,hashes);

  TwoBytesKeygen(maxlen,c);

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  return result;
}